

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

void __thiscall rw::HAnimHierarchy::attachByIndex(HAnimHierarchy *this,int32 idx)

{
  Frame *pFVar1;
  Frame *f;
  int32 id;
  int32 idx_local;
  HAnimHierarchy *this_local;
  
  pFVar1 = findUnattachedById(this,this->parentFrame,this->nodeInfo[idx].id);
  if (pFVar1 != (Frame *)0x0) {
    this->nodeInfo[idx].frame = pFVar1;
  }
  return;
}

Assistant:

void
HAnimHierarchy::attachByIndex(int32 idx)
{
	int32 id = this->nodeInfo[idx].id;
//	Frame *f = findById(this->parentFrame, id);
	Frame *f = findUnattachedById(this, this->parentFrame, id);
	if(f)
		this->nodeInfo[idx].frame = f;
}